

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O2

void __thiscall
soplex::SPxMainSM<double>::FixBoundsPS::FixBoundsPS
          (FixBoundsPS *this,SPxLPBase<double> *lp,int j,double val,
          shared_ptr<soplex::Tolerances> *tols)

{
  double dVar1;
  bool bVar2;
  double *pdVar3;
  SPxInternalCodeException *this_00;
  VarStatus VVar4;
  double eps;
  double eps_00;
  double eps_01;
  allocator local_61;
  double local_60;
  double local_58;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_50;
  string local_40;
  
  local_60 = val;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,&tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  PostStep::PostStep(&this->super_PostStep,"FixBounds",(shared_ptr<soplex::Tolerances> *)&local_50,
                     (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum,
                     (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__PostStep_00333eb0;
  this->m_j = j;
  dVar1 = (lp->super_LPColSetBase<double>).low.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[j];
  local_58 = (lp->super_LPColSetBase<double>).up.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[j];
  eps = PostStep::feastol(&this->super_PostStep);
  bVar2 = EQrel<double,double,double>(dVar1,local_58,eps);
  if (bVar2) {
    VVar4 = FIXED;
  }
  else {
    dVar1 = (lp->super_LPColSetBase<double>).low.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[j];
    (*(this->super_PostStep)._vptr_PostStep[6])(this);
    bVar2 = EQrel<double,double,double>(local_60,dVar1,eps_00);
    if (bVar2) {
      VVar4 = ON_LOWER;
    }
    else {
      dVar1 = (lp->super_LPColSetBase<double>).up.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[j];
      (*(this->super_PostStep)._vptr_PostStep[6])(this);
      bVar2 = EQrel<double,double,double>(local_60,dVar1,eps_01);
      VVar4 = ON_UPPER;
      if (!bVar2) {
        dVar1 = (lp->super_LPColSetBase<double>).low.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[j];
        pdVar3 = (double *)infinity();
        if ((-*pdVar3 < dVar1) ||
           (dVar1 = (lp->super_LPColSetBase<double>).up.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[j], pdVar3 = (double *)infinity(),
           dVar1 < *pdVar3)) {
          this_00 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string
                    ((string *)&local_40,"XMAISM14 This should never happen.",&local_61);
          SPxInternalCodeException::SPxInternalCodeException(this_00,&local_40);
          __cxa_throw(this_00,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
        }
        VVar4 = ZERO;
      }
    }
  }
  this->m_status = VVar4;
  return;
}

Assistant:

FixBoundsPS(const SPxLPBase<R>& lp, int j, R val, std::shared_ptr<Tolerances> tols)
         : PostStep("FixBounds", tols, lp.nRows(), lp.nCols())
         , m_j(j)
      {
         if(EQrel(lp.lower(j), lp.upper(j), this->feastol()))
            m_status = SPxSolverBase<R>::FIXED;
         else if(EQrel(val, lp.lower(j), this->feastol()))
            m_status = SPxSolverBase<R>::ON_LOWER;
         else if(EQrel(val, lp.upper(j), this->feastol()))
            m_status = SPxSolverBase<R>::ON_UPPER;
         else if(lp.lower(j) <= R(-infinity) && lp.upper(j) >= R(infinity))
            m_status = SPxSolverBase<R>::ZERO;
         else
         {
            throw SPxInternalCodeException("XMAISM14 This should never happen.");
         }
      }